

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O2

bool __thiscall glu::Layout::operator==(Layout *this,Layout *other)

{
  int iVar1;
  
  iVar1 = memcmp(this,other,0x14);
  return iVar1 == 0;
}

Assistant:

bool Layout::operator== (const Layout& other) const
{
	return	location == other.location &&
			binding == other.binding &&
			offset == other.offset &&
			format == other.format &&
			matrixOrder == other.matrixOrder;
}